

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

iterator * __thiscall minibag::View::iterator::operator=(iterator *this,iterator *i)

{
  if (this != i) {
    this->view_ = i->view_;
    std::vector<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>::operator=
              (&this->iters_,&i->iters_);
    this->view_revision_ = i->view_revision_;
    if (this->message_instance_ != (MessageInstance *)0x0) {
      operator_delete(this->message_instance_,0x28);
      this->message_instance_ = (MessageInstance *)0x0;
    }
  }
  return this;
}

Assistant:

View::iterator &View::iterator::operator=(iterator const& i) {
    if (this != &i) {
        view_ = i.view_;
        iters_ = i.iters_;
        view_revision_ = i.view_revision_;
        if (message_instance_ != NULL) {
            delete message_instance_;
            message_instance_ = NULL;
        }
    }
    return *this;
}